

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gennorm2.cpp
# Opt level: O2

void icu_63::parseFile(ifstream *f,Normalizer2DataBuilder *builder)

{
  UErrorCode *pErrorCode;
  byte bVar1;
  _Alloc_hider s;
  int iVar2;
  int32_t iVar3;
  int32_t textLength;
  UErrorCode __status;
  istream *piVar4;
  char *pcVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint32_t startCP;
  uint32_t endCP;
  ConstChar16Ptr local_118;
  char *delimiter;
  IcuToolErrorCode errorCode;
  string lineString;
  char *end;
  UChar uchars [31];
  
  pErrorCode = &errorCode.super_ErrorCode.errorCode;
  errorCode.super_ErrorCode.errorCode = U_ZERO_ERROR;
  errorCode.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_0039ffb8;
  errorCode.location = "gennorm2/parseFile()";
  lineString._M_dataplus._M_p = (pointer)&lineString.field_2;
  lineString._M_string_length = 0;
  lineString.field_2._M_local_buf[0] = '\0';
LAB_001e6cca:
  do {
    while( true ) {
      do {
        do {
          piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)f,(string *)&lineString);
          s = lineString._M_dataplus;
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
            std::__cxx11::string::~string((string *)&lineString);
            IcuToolErrorCode::~IcuToolErrorCode(&errorCode);
            return;
          }
        } while (lineString._M_string_length == 0);
        pcVar5 = strchr(lineString._M_dataplus._M_p,0x23);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
        u_rtrim(s._M_p);
      } while (*s._M_p == '\0');
      if (*s._M_p != '*') break;
      pcVar5 = u_skipWhitespace(s._M_p + 1);
      iVar2 = strncmp(pcVar5,"Unicode",7);
      if (iVar2 == 0) {
        pcVar5 = u_skipWhitespace(pcVar5 + 7);
        Normalizer2DataBuilder::setUnicodeVersion(builder,pcVar5);
      }
    }
    iVar3 = u_parseCodePointRangeAnyTerminator(s._M_p,&startCP,&endCP,&delimiter,pErrorCode);
    if (U_ZERO_ERROR < errorCode.super_ErrorCode.errorCode) {
      fprintf(_stderr,"gennorm2 error: parsing code point range from %s\n",s._M_p);
      __status = ErrorCode::reset(&errorCode.super_ErrorCode);
LAB_001e6f8c:
      exit(__status);
    }
    if ((0xd7ff < endCP) && (startCP < 0xe000)) {
      fprintf(_stderr,"gennorm2 error: value or mapping for surrogate code points: %s\n",s._M_p);
      iVar2 = 1;
      goto LAB_001e7008;
    }
    delimiter = u_skipWhitespace(delimiter);
    bVar1 = *delimiter;
    if (bVar1 - 0x3d < 2) {
      textLength = u_parseString((char *)((byte *)delimiter + 1),uchars,0x1f,(uint32_t *)0x0,
                                 pErrorCode);
      if (U_ZERO_ERROR < errorCode.super_ErrorCode.errorCode) {
        fprintf(_stderr,"gennorm2 error: parsing mapping string from %s\n",s._M_p);
        __status = ErrorCode::reset(&errorCode.super_ErrorCode);
        goto LAB_001e6f8c;
      }
      local_118.p_ = uchars;
      UnicodeString::UnicodeString((UnicodeString *)&end,'\0',&local_118,textLength);
      uVar7 = startCP;
      if (*delimiter == '=') {
        if (iVar3 != 1) {
          pcVar5 = "gennorm2 error: round-trip mapping for more than 1 code point on %s\n";
          goto LAB_001e6ffc;
        }
        Normalizer2DataBuilder::setRoundTripMapping(builder,startCP,(UnicodeString *)&end);
      }
      else {
        for (; (int)uVar7 <= (int)endCP; uVar7 = uVar7 + 1) {
          Normalizer2DataBuilder::setOneWayMapping(builder,uVar7,(UnicodeString *)&end);
        }
      }
      UnicodeString::~UnicodeString((UnicodeString *)&end);
      goto LAB_001e6cca;
    }
    if (bVar1 != 0x2d) {
      if (bVar1 == 0x3a) {
        pcVar5 = u_skipWhitespace((char *)((byte *)delimiter + 1));
        uVar6 = strtoul(pcVar5,&end,10);
        if (((pcVar5 < end) && (pcVar5 = u_skipWhitespace(end), *pcVar5 == '\0')) &&
           (uVar7 = startCP, uVar6 < 0xff)) {
          for (; (int)uVar7 <= (int)endCP; uVar7 = uVar7 + 1) {
            Normalizer2DataBuilder::setCC(builder,uVar7,(uint8_t)uVar6);
          }
          goto LAB_001e6cca;
        }
        pcVar5 = "gennorm2 error: parsing ccc from %s\n";
      }
      else {
        pcVar5 = "gennorm2 error: unrecognized data line %s\n";
      }
LAB_001e6ffc:
      fprintf(_stderr,pcVar5,s._M_p);
      iVar2 = 9;
LAB_001e7008:
      exit(iVar2);
    }
    pcVar5 = u_skipWhitespace((char *)((byte *)delimiter + 1));
    uVar7 = startCP;
    if (*pcVar5 != '\0') {
      pcVar5 = "gennorm2 error: parsing remove-mapping %s\n";
      goto LAB_001e6ffc;
    }
    for (; (int)uVar7 <= (int)endCP; uVar7 = uVar7 + 1) {
      Normalizer2DataBuilder::removeMapping(builder,uVar7);
    }
  } while( true );
}

Assistant:

void parseFile(std::ifstream &f, Normalizer2DataBuilder &builder) {
    IcuToolErrorCode errorCode("gennorm2/parseFile()");
    std::string lineString;
    uint32_t startCP, endCP;
    while(std::getline(f, lineString)) {
        if (lineString.empty()) {
            continue;  // skip empty lines.
        }
#if (U_CPLUSPLUS_VERSION >= 11)
        char *line = &lineString.front();
#else
        char *line = &lineString.at(0);
#endif
        char *comment=(char *)strchr(line, '#');
        if(comment!=NULL) {
            *comment=0;
        }
        u_rtrim(line);
        if(line[0]==0) {
            continue;  // skip empty and comment-only lines
        }
        if(line[0]=='*') {
            const char *s=u_skipWhitespace(line+1);
            if(0==strncmp(s, "Unicode", 7)) {
                s=u_skipWhitespace(s+7);
                builder.setUnicodeVersion(s);
            }
            continue;  // reserved syntax
        }
        const char *delimiter;
        int32_t rangeLength=
            u_parseCodePointRangeAnyTerminator(line, &startCP, &endCP, &delimiter, errorCode);
        if(errorCode.isFailure()) {
            fprintf(stderr, "gennorm2 error: parsing code point range from %s\n", line);
            exit(errorCode.reset());
        }
        if (endCP >= 0xd800 && startCP <= 0xdfff) {
                fprintf(stderr, "gennorm2 error: value or mapping for surrogate code points: %s\n",
                        line);
                exit(U_ILLEGAL_ARGUMENT_ERROR);
        }
        delimiter=u_skipWhitespace(delimiter);
        if(*delimiter==':') {
            const char *s=u_skipWhitespace(delimiter+1);
            char *end;
            unsigned long value=strtoul(s, &end, 10);
            if(end<=s || *u_skipWhitespace(end)!=0 || value>=0xff) {
                fprintf(stderr, "gennorm2 error: parsing ccc from %s\n", line);
                exit(U_PARSE_ERROR);
            }
            for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                builder.setCC(c, (uint8_t)value);
            }
            continue;
        }
        if(*delimiter=='-') {
            if(*u_skipWhitespace(delimiter+1)!=0) {
                fprintf(stderr, "gennorm2 error: parsing remove-mapping %s\n", line);
                exit(U_PARSE_ERROR);
            }
            for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                builder.removeMapping(c);
            }
            continue;
        }
        if(*delimiter=='=' || *delimiter=='>') {
            UChar uchars[Normalizer2Impl::MAPPING_LENGTH_MASK];
            int32_t length=u_parseString(delimiter+1, uchars, UPRV_LENGTHOF(uchars), NULL, errorCode);
            if(errorCode.isFailure()) {
                fprintf(stderr, "gennorm2 error: parsing mapping string from %s\n", line);
                exit(errorCode.reset());
            }
            UnicodeString mapping(FALSE, uchars, length);
            if(*delimiter=='=') {
                if(rangeLength!=1) {
                    fprintf(stderr,
                            "gennorm2 error: round-trip mapping for more than 1 code point on %s\n",
                            line);
                    exit(U_PARSE_ERROR);
                }
                builder.setRoundTripMapping((UChar32)startCP, mapping);
            } else {
                for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                    builder.setOneWayMapping(c, mapping);
                }
            }
            continue;
        }
        fprintf(stderr, "gennorm2 error: unrecognized data line %s\n", line);
        exit(U_PARSE_ERROR);
    }
}